

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O1

Mio_Gate_t * Mio_LibraryReadGateByName(Mio_Library_t *pLib,char *pName,char *pOutName)

{
  Mio_Gate_t *pMVar1;
  int iVar2;
  Mio_Gate_t *in_RAX;
  Mio_Gate_t *pGate;
  Mio_Gate_t *local_18;
  
  local_18 = in_RAX;
  iVar2 = st__lookup(pLib->tName2Gate,pName,(char **)&local_18);
  if (iVar2 != 0) {
    if (pOutName == (char *)0x0) {
      return local_18;
    }
    iVar2 = strcmp(local_18->pOutName,pOutName);
    if (iVar2 == 0) {
      return local_18;
    }
    pMVar1 = local_18->pTwin;
    if ((pMVar1 != (Mio_Gate_t *)0x0) && (iVar2 = strcmp(pMVar1->pOutName,pOutName), iVar2 == 0)) {
      return pMVar1;
    }
  }
  return (Mio_Gate_t *)0x0;
}

Assistant:

Mio_Gate_t * Mio_LibraryReadGateByName( Mio_Library_t * pLib, char * pName, char * pOutName )      
{ 
    Mio_Gate_t * pGate;
    if ( ! st__lookup( pLib->tName2Gate, pName, (char **)&pGate ) )
        return NULL;
    if ( pOutName == NULL )
        return pGate;
    if ( !strcmp(pGate->pOutName, pOutName) )
        return pGate;
    if ( pGate->pTwin && !strcmp(pGate->pTwin->pOutName, pOutName) )
        return pGate->pTwin;
    return NULL;
}